

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O3

uint16_t eia608_from_utf8_2(utf8_char_t *c1,utf8_char_t *c2)

{
  uint16_t uVar1;
  uint16_t uVar2;
  
  uVar1 = _eia608_from_utf8(c1);
  uVar2 = _eia608_from_utf8(c2);
  if ((uVar2 & 0x6000) == 0 || (uVar1 & 0x6000) == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = CONCAT11(eia608_parity_table[uVar1 >> 8 & 0x7f],eia608_parity_table[uVar2 >> 8 & 0x7f]);
  }
  return uVar1;
}

Assistant:

uint16_t eia608_from_utf8_2(const utf8_char_t* c1, const utf8_char_t* c2)
{
    uint16_t cc1 = _eia608_from_utf8(c1);
    uint16_t cc2 = _eia608_from_utf8(c2);
    return eia608_from_basicna(cc1, cc2);
}